

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.h
# Opt level: O0

Ch * __thiscall
rapidjson::
GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::CopyPart(GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
           *this,Ch *to,Ch *from,size_t len)

{
  Ch *next;
  size_t len_local;
  Ch *from_local;
  Ch *to_local;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *this_local;
  
  if (to == (Ch *)0x0) {
    __assert_fail("to != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/uri.h"
                  ,400,
                  "Ch *rapidjson::GenericUri<rapidjson::GenericValue<rapidjson::UTF8<>>>::CopyPart(Ch *, Ch *, std::size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
                 );
  }
  if (from != (Ch *)0x0) {
    memcpy(to,from,len);
    to[len] = '\0';
    return to + len + 1;
  }
  __assert_fail("from != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/uri.h"
                ,0x191,
                "Ch *rapidjson::GenericUri<rapidjson::GenericValue<rapidjson::UTF8<>>>::CopyPart(Ch *, Ch *, std::size_t) [ValueType = rapidjson::GenericValue<rapidjson::UTF8<>>, Allocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

Ch* CopyPart(Ch* to, Ch* from, std::size_t len) {
        RAPIDJSON_ASSERT(to != 0);
        RAPIDJSON_ASSERT(from != 0);
        std::memcpy(to, from, len * sizeof(Ch));
        to[len] = '\0';
        Ch* next = to + len + 1;
        return next;
    }